

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O0

void __thiscall tst_helpers_map::sequenceTypes(tst_helpers_map *this)

{
  tst_helpers_map *this_local;
  
  anon_unknown.dwarf_354a3::SequenceTester<QList<int>_>::exec();
  anon_unknown.dwarf_354a3::SequenceTester<QList<int>_>::exec();
  anon_unknown.dwarf_354a3::SequenceTester<std::__cxx11::list<int,_std::allocator<int>_>_>::exec();
  anon_unknown.dwarf_354a3::SequenceTester<std::vector<int,_std::allocator<int>_>_>::exec();
  return;
}

Assistant:

void tst_helpers_map::sequenceTypes()
{
    SequenceTester<QList<int>>::exec();
    SequenceTester<QVector<int>>::exec();
    SequenceTester<std::list<int>>::exec();
    SequenceTester<std::vector<int>>::exec();
}